

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::StandardCaseItemSyntax::setChild
          (StandardCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  Token TVar3;
  SyntaxNode *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  SyntaxNode *local_38;
  SyntaxNode *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  StandardCaseItemSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                       (pSVar2);
    SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator=(&this->expressions,pSVar1);
  }
  else if (index == 1) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->colon).kind = (undefined2)local_28;
    (this->colon).field_0x2 = local_28._2_1_;
    (this->colon).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->colon).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->colon).info = local_20;
  }
  else {
    if (index != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_b8,&local_d8,":");
      std::__cxx11::to_string(&local_110,0x2f2a);
      std::operator+(&local_98,&local_b8,&local_110);
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_58);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_138 = (SyntaxNode *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::SyntaxNode>(pSVar2);
    }
    local_38 = local_138;
    not_null<slang::syntax::SyntaxNode*>::not_null<slang::syntax::SyntaxNode*,void>
              ((not_null<slang::syntax::SyntaxNode*> *)&local_30,&local_38);
    (this->clause).ptr = local_30;
  }
  return;
}

Assistant:

void StandardCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expressions = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: colon = child.token(); return;
        case 2: clause = child.node() ? &child.node()->as<SyntaxNode>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}